

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * convertLatin1toUTF8(char *source)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  char *s;
  
  cVar2 = *source;
  if (cVar2 == '\0') {
    sVar4 = 1;
  }
  else {
    pcVar1 = source + 1;
    sVar4 = 1;
    do {
      sVar4 = (sVar4 - (-1 < cVar2)) + 2;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  pcVar1 = (char *)_glfw_calloc(sVar4,1);
  cVar2 = *source;
  if (cVar2 != '\0') {
    pcVar3 = source + 1;
    s = pcVar1;
    do {
      sVar4 = _glfwEncodeUTF8(s,(int)cVar2);
      s = s + sVar4;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return pcVar1;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = _glfw_calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += _glfwEncodeUTF8(tp, *sp);

    return target;
}